

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O3

void __thiscall
llvm::iterator_range<llvm::DWARFDebugNames::ValueIterator>::iterator_range
          (iterator_range<llvm::DWARFDebugNames::ValueIterator> *this,ValueIterator *begin_iterator,
          ValueIterator *end_iterator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  (this->begin_iterator).IsLocal = begin_iterator->IsLocal;
  (this->begin_iterator).CurrentIndex = begin_iterator->CurrentIndex;
  optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
            (&(this->begin_iterator).CurrentEntry.Storage,&(begin_iterator->CurrentEntry).Storage);
  (this->begin_iterator).DataOffset = begin_iterator->DataOffset;
  paVar1 = &(this->begin_iterator).Key.field_2;
  (this->begin_iterator).Key._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (begin_iterator->Key)._M_dataplus._M_p;
  paVar4 = &(begin_iterator->Key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(begin_iterator->Key).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->begin_iterator).Key.field_2 + 8) = uVar3;
  }
  else {
    (this->begin_iterator).Key._M_dataplus._M_p = pcVar2;
    (this->begin_iterator).Key.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->begin_iterator).Key._M_string_length = (begin_iterator->Key)._M_string_length;
  (begin_iterator->Key)._M_dataplus._M_p = (pointer)paVar4;
  (begin_iterator->Key)._M_string_length = 0;
  (begin_iterator->Key).field_2._M_local_buf[0] = '\0';
  (this->begin_iterator).Hash.Storage = (begin_iterator->Hash).Storage;
  (this->end_iterator).CurrentIndex = end_iterator->CurrentIndex;
  (this->end_iterator).IsLocal = end_iterator->IsLocal;
  optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
            (&(this->end_iterator).CurrentEntry.Storage,&(end_iterator->CurrentEntry).Storage);
  (this->end_iterator).DataOffset = end_iterator->DataOffset;
  paVar1 = &(this->end_iterator).Key.field_2;
  (this->end_iterator).Key._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (end_iterator->Key)._M_dataplus._M_p;
  paVar4 = &(end_iterator->Key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(end_iterator->Key).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->end_iterator).Key.field_2 + 8) = uVar3;
  }
  else {
    (this->end_iterator).Key._M_dataplus._M_p = pcVar2;
    (this->end_iterator).Key.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->end_iterator).Key._M_string_length = (end_iterator->Key)._M_string_length;
  (end_iterator->Key)._M_dataplus._M_p = (pointer)paVar4;
  (end_iterator->Key)._M_string_length = 0;
  (end_iterator->Key).field_2._M_local_buf[0] = '\0';
  (this->end_iterator).Hash.Storage = (end_iterator->Hash).Storage;
  return;
}

Assistant:

iterator_range(IteratorT begin_iterator, IteratorT end_iterator)
      : begin_iterator(std::move(begin_iterator)),
        end_iterator(std::move(end_iterator)) {}